

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

AssertionResult * __thiscall
Catch::ResultBuilder::build(AssertionResult *__return_storage_ptr__,ResultBuilder *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  string local_b8;
  undefined1 local_98 [32];
  _Alloc_hider local_78;
  char local_68 [16];
  OfType local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->m_data).resultType == Unknown) {
    __assert_fail("m_data.resultType != ResultWas::Unknown",
                  "/workspace/llm4binary/github/license_c_cmakelists/emilw[P]HttpClient/source/tests/catch.hpp"
                  ,0x1ba0,"AssertionResult Catch::ResultBuilder::build() const");
  }
  pcVar2 = (this->m_data).reconstructedExpression._M_dataplus._M_p;
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar2,
             pcVar2 + (this->m_data).reconstructedExpression._M_string_length);
  pcVar2 = (this->m_data).message._M_dataplus._M_p;
  local_78._M_p = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + (this->m_data).message._M_string_length);
  local_58 = (this->m_data).resultType;
  if ((this->m_exprComponents).testFalse == true) {
    if (local_58 == Ok) {
      local_58 = ExpressionFailed;
    }
    else if (local_58 == ExpressionFailed) {
      local_58 = Ok;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_78,(string *)&local_b8);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  reconstructExpression_abi_cxx11_(&local_b8,this);
  std::__cxx11::string::operator=((string *)local_98,(string *)&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((this->m_exprComponents).testFalse == true) {
    iVar3 = std::__cxx11::string::compare((char *)&(this->m_exprComponents).op);
    if (iVar3 == 0) {
      std::operator+(&local_b8,"!",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_b8);
      local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar1) goto LAB_0012b102;
    }
    else {
      std::operator+(&local_50,"!(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_b8.field_2._M_allocated_capacity = *psVar5;
        local_b8.field_2._8_8_ = plVar4[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar5;
        local_b8._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b8._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_98,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0012b102;
    }
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_0012b102:
  AssertionResult::AssertionResult
            (__return_storage_ptr__,&this->m_assertionInfo,(AssertionResultData *)local_98);
  if (local_78._M_p != local_68) {
    operator_delete(local_78._M_p);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult ResultBuilder::build() const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if testFalse is set
        if( m_exprComponents.testFalse ) {
            if( data.resultType == ResultWas::Ok )
                data.resultType = ResultWas::ExpressionFailed;
            else if( data.resultType == ResultWas::ExpressionFailed )
                data.resultType = ResultWas::Ok;
        }

        data.message = m_stream.oss.str();
        data.reconstructedExpression = reconstructExpression();
        if( m_exprComponents.testFalse ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( m_assertionInfo, data );
    }